

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SkipBitUi32s(CSzData *sd,UInt32 numItems)

{
  Byte *pBVar1;
  ulong uVar2;
  size_t numBytes;
  UInt32 numDefined;
  Byte allAreDefined;
  UInt32 numItems_local;
  CSzData *sd_local;
  
  if (sd->Size == 0) {
    sd_local._4_4_ = 0x10;
  }
  else {
    sd->Size = sd->Size - 1;
    pBVar1 = sd->Data;
    sd->Data = pBVar1 + 1;
    numBytes._4_4_ = numItems;
    if (*pBVar1 == '\0') {
      uVar2 = (ulong)(numItems + 7 >> 3);
      if (sd->Size < uVar2) {
        return 0x10;
      }
      numBytes._4_4_ = CountDefinedBits(sd->Data,numItems);
      sd->Size = sd->Size - uVar2;
      sd->Data = sd->Data + uVar2;
    }
    if (sd->Size >> 2 < (ulong)numBytes._4_4_) {
      sd_local._4_4_ = 0x10;
    }
    else {
      sd->Size = sd->Size + (ulong)numBytes._4_4_ * -4;
      sd->Data = sd->Data + (ulong)numBytes._4_4_ * 4;
      sd_local._4_4_ = 0;
    }
  }
  return sd_local._4_4_;
}

Assistant:

static SRes SkipBitUi32s(CSzData *sd, UInt32 numItems)
{
  Byte allAreDefined;
  UInt32 numDefined = numItems;
  SZ_READ_BYTE(allAreDefined);
  if (!allAreDefined)
  {
    size_t numBytes = (numItems + 7) >> 3;
    if (numBytes > sd->Size)
      return SZ_ERROR_ARCHIVE;
    numDefined = CountDefinedBits(sd->Data, numItems);
    SKIP_DATA(sd, numBytes);
  }
  if (numDefined > (sd->Size >> 2))
    return SZ_ERROR_ARCHIVE;
  SKIP_DATA(sd, (size_t)numDefined * 4);
  return SZ_OK;
}